

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

void __thiscall
dd::TaskQueueStdlib::PostTask
          (TaskQueueStdlib *this,
          unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task)

{
  pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>
  local_38;
  OrderId local_28;
  OrderId order;
  AutoLock lock;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task_local;
  TaskQueueStdlib *this_local;
  
  lock._lock = (Lock *)task;
  AutoLock::AutoLock((AutoLock *)&order,&this->_pending_lock);
  local_28 = this->_thread_posting_order;
  this->_thread_posting_order = local_28 + 1;
  std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>::
  pair<unsigned_long_&,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>,_true>
            (&local_38,&local_28,task);
  std::
  queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
  ::push(&this->_pending_queue,&local_38);
  std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>::
  ~pair(&local_38);
  AutoLock::~AutoLock((AutoLock *)&order);
  NotifyWake(this);
  return;
}

Assistant:

void TaskQueueStdlib::PostTask(std::unique_ptr<QueuedTask> task)
	{
		{
			AutoLock lock(_pending_lock);
			OrderId order = _thread_posting_order++;
			_pending_queue.push(std::pair<OrderId, std::unique_ptr<QueuedTask>>(order, std::move(task)));
		}
		NotifyWake();
	}